

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

void __thiscall MeCab::Viterbi::Viterbi(Viterbi *this)

{
  whatlog *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Viterbi_001c6900;
  scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::scoped_ptr
            ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)&in_RDI->field_0x8,
             (Tokenizer<mecab_node_t,_mecab_path_t> *)0x0);
  scoped_ptr<MeCab::Connector>::scoped_ptr
            ((scoped_ptr<MeCab::Connector> *)&in_RDI->field_0x18,(Connector *)0x0);
  *(undefined4 *)&in_RDI->field_0x28 = 0;
  whatlog::whatlog(in_RDI);
  return;
}

Assistant:

Viterbi::Viterbi()
    :  tokenizer_(0), connector_(0),
       cost_factor_(0) {}